

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O0

void __thiscall pass_verilog_stub_Test::~pass_verilog_stub_Test(pass_verilog_stub_Test *this)

{
  pass_verilog_stub_Test *this_local;
  
  ~pass_verilog_stub_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, verilog_stub) {  // NOLINT
    Context c;
    auto &mod1 = c.generator("module1");
    mod1.port(PortDirection::In, "in", 1);
    mod1.port(PortDirection::Out, "out", 1);
    // set it to stub
    mod1.set_is_stub(true);

    EXPECT_NO_THROW(zero_out_stubs(&mod1));

    EXPECT_NO_THROW(verify_generator_connectivity(&mod1));
}